

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O0

void test_bson_utf8_get_char(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uchar *puVar4;
  char *c;
  
  pcVar3 = test_bson_utf8_get_char::test1;
  iVar1 = bson_utf8_get_char(test_bson_utf8_get_char::test1);
  if (iVar1 != 0x61) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x72,"test_bson_utf8_get_char","bson_utf8_get_char (c) == \'a\'");
    abort();
  }
  uVar2 = bson_utf8_next_char(pcVar3);
  iVar1 = bson_utf8_get_char(uVar2);
  if (iVar1 != 0x73) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x74,"test_bson_utf8_get_char","bson_utf8_get_char (c) == \'s\'");
    abort();
  }
  uVar2 = bson_utf8_next_char(uVar2);
  iVar1 = bson_utf8_get_char(uVar2);
  if (iVar1 != 100) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x76,"test_bson_utf8_get_char","bson_utf8_get_char (c) == \'d\'");
    abort();
  }
  uVar2 = bson_utf8_next_char(uVar2);
  iVar1 = bson_utf8_get_char(uVar2);
  if (iVar1 != 0x66) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x78,"test_bson_utf8_get_char","bson_utf8_get_char (c) == \'f\'");
    abort();
  }
  pcVar3 = (char *)bson_utf8_next_char(uVar2);
  if (*pcVar3 != '\0') {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x7a,"test_bson_utf8_get_char","!*c");
    abort();
  }
  iVar1 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
  if (iVar1 != 0x20ac) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x7d,"test_bson_utf8_get_char","bson_utf8_get_char (c) == 0x20AC");
    abort();
  }
  puVar4 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
  if (puVar4 != test_bson_utf8_get_char::test2 + 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x7f,"test_bson_utf8_get_char","c == (const char *) test2 + 3");
    abort();
  }
  iVar1 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
  if (iVar1 != 0x20) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x80,"test_bson_utf8_get_char","bson_utf8_get_char (c) == \' \'");
    abort();
  }
  uVar2 = bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
  iVar1 = bson_utf8_get_char(uVar2);
  if (iVar1 != 0x20ac) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x82,"test_bson_utf8_get_char","bson_utf8_get_char (c) == 0x20AC");
    abort();
  }
  uVar2 = bson_utf8_next_char(uVar2);
  iVar1 = bson_utf8_get_char(uVar2);
  if (iVar1 != 0x20) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x84,"test_bson_utf8_get_char","bson_utf8_get_char (c) == \' \'");
    abort();
  }
  uVar2 = bson_utf8_next_char(uVar2);
  iVar1 = bson_utf8_get_char(uVar2);
  if (iVar1 != 0x20ac) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x86,"test_bson_utf8_get_char","bson_utf8_get_char (c) == 0x20AC");
    abort();
  }
  pcVar3 = (char *)bson_utf8_next_char(uVar2);
  if (*pcVar3 != '\0') {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x88,"test_bson_utf8_get_char","!*c");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_utf8_get_char (void)
{
   static const char *test1 = "asdf";
   static const unsigned char test2[] = {
      0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, 0};
   const char *c;

   c = test1;
   BSON_ASSERT (bson_utf8_get_char (c) == 'a');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 's');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'd');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'f');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);

   c = (const char *) test2;
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (c == (const char *) test2 + 3);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);
}